

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_extDict_4
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  BYTE *__s1;
  uint uVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  U32 UVar20;
  BYTE *pBVar21;
  ulong uVar22;
  uint uVar23;
  uint local_f4;
  uint *local_f0;
  uint *local_e0;
  uint local_d0;
  uint local_84;
  ZSTD_matchState_t *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_match_t *local_50;
  U32 *local_48;
  ulong local_40;
  U32 *local_38;
  
  local_50 = matches;
  if ((ms->cParams).minMatch != 4) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar21 = (ms->window).base;
  uVar16 = (ulong)ms->nextToUpdate;
  if (ip < pBVar21 + uVar16) {
    return 0;
  }
  UVar20 = 1;
  local_80 = ms;
  while( true ) {
    uVar23 = (uint)uVar16;
    uVar4 = (uint)((long)ip - (long)pBVar21);
    if (uVar4 <= uVar23) break;
    UVar3 = ZSTD_insertBt1(ms,pBVar21 + uVar16,iHighLimit,uVar4,4,1);
    uVar16 = (ulong)(UVar3 + uVar23);
    if (UVar3 + uVar23 <= uVar23) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar21) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar21) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar4;
  uVar4 = (ms->cParams).targetLength;
  uVar23 = 0xfff;
  if (uVar4 < 0xfff) {
    uVar23 = uVar4;
  }
  uVar4 = (ms->cParams).hashLog;
  if (0x20 < uVar4) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_40 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar4 & 0x1fU));
  local_60 = (ms->window).base;
  uVar18 = (int)ip - (int)local_60;
  uVar17 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar16 = 0;
  uVar4 = uVar18 - uVar17;
  if (uVar18 < uVar17) {
    uVar4 = 0;
  }
  uVar5 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar1 = (ms->window).lowLimit;
  uVar15 = uVar18 - uVar5;
  if (uVar18 - uVar1 <= uVar5) {
    uVar15 = uVar1;
  }
  if (ms->loadedDictEnd != 0) {
    uVar15 = uVar1;
  }
  uVar1 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  local_48 = ms->hashTable;
  uVar2 = local_48[local_40];
  local_38 = ms->chainTable;
  local_58 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar19 = (ulong)uVar5;
  local_70 = local_58 + uVar19;
  local_78 = local_60 + uVar19;
  uVar7 = (ulong)((uVar17 & uVar18) * 2);
  local_e0 = local_38 + uVar7;
  local_f0 = local_38 + uVar7 + 1;
  local_f4 = uVar18 + 9;
  uVar7 = (ulong)(lengthToBeat - 1);
  local_68 = ip + 4;
  for (uVar22 = (ulong)ll0; ll0 + 3 != uVar22; uVar22 = uVar22 + 1) {
    if (uVar22 == 3) {
      uVar12 = *rep - 1;
    }
    else {
      uVar12 = rep[uVar22];
    }
    if (uVar18 < uVar5) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    uVar13 = uVar18 - uVar12;
    if (uVar12 - 1 < uVar18 - uVar5) {
      uVar9 = 0;
      if ((uVar15 <= uVar13) && (*(int *)ip == *(int *)(ip + -(ulong)uVar12))) {
        sVar8 = ZSTD_count(local_68,local_68 + -(ulong)uVar12,iHighLimit);
        iVar6 = (int)sVar8;
LAB_001d6f49:
        uVar9 = (ulong)(iVar6 + 4);
      }
    }
    else {
      if (uVar18 < uVar15) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar9 = 0;
      if (((uVar12 - 1 < uVar18 - uVar15) && (uVar13 - uVar5 < 0xfffffffd)) &&
         (*(int *)ip == *(int *)(local_58 + uVar13))) {
        sVar8 = ZSTD_count_2segments
                          (local_68,(BYTE *)((long)(local_58 + uVar13) + 4),iHighLimit,local_70,
                           local_78);
        iVar6 = (int)sVar8;
        goto LAB_001d6f49;
      }
    }
    if (uVar7 < uVar9) {
      local_50[uVar16].off = UVar20;
      local_50[uVar16].len = (uint)uVar9;
      uVar12 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar12;
      if (uVar23 < (uint)uVar9) {
        return uVar12;
      }
      uVar7 = uVar9;
      if (ip + uVar9 == iHighLimit) {
        return uVar12;
      }
    }
    UVar20 = UVar20 + 1;
  }
  local_48[local_40] = uVar18;
  uVar22 = 0;
  uVar9 = 0;
  local_d0 = 1 << ((byte)uVar1 & 0x1f);
  do {
    uVar14 = (ulong)uVar2;
    UVar20 = (U32)uVar16;
    if ((local_d0 == 0) || (uVar2 < uVar15 + (uVar15 == 0))) goto LAB_001d71d3;
    uVar10 = uVar22;
    if (uVar9 < uVar22) {
      uVar10 = uVar9;
    }
    if (uVar18 <= uVar2) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f1,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar14 + uVar10 < uVar19) {
      __s1 = local_58 + uVar14;
      iVar6 = bcmp(__s1,ip,uVar10);
      if (iVar6 != 0) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81fa,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar8 = ZSTD_count_2segments(ip + uVar10,__s1 + uVar10,iHighLimit,local_70,local_78);
      uVar10 = sVar8 + uVar10;
      pBVar21 = local_60 + uVar14;
      if (uVar10 + uVar14 < uVar19) {
        pBVar21 = __s1;
      }
    }
    else {
      pBVar21 = local_60 + uVar14;
      if ((uVar5 <= uVar2) && (iVar6 = bcmp(pBVar21,ip,uVar10), iVar6 != 0)) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f6,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar8 = ZSTD_count(ip + uVar10,pBVar21 + uVar10,iHighLimit);
      uVar10 = sVar8 + uVar10;
    }
    if (uVar7 < uVar10) {
      if (local_f4 < uVar2 || local_f4 - uVar2 == 0) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8203,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_f4 - uVar2 < uVar10) {
        local_f4 = uVar2 + (U32)uVar10;
      }
      local_50[uVar16].off = (uVar18 + 3) - uVar2;
      local_50[uVar16].len = (U32)uVar10;
      UVar20 = UVar20 + 1;
      uVar16 = (ulong)UVar20;
      if ((0x1000 < uVar10) || (uVar7 = uVar10, ip + uVar10 == iHighLimit)) goto LAB_001d71d3;
    }
    UVar20 = (U32)uVar16;
    puVar11 = local_38 + (uVar2 & uVar17) * 2;
    if (pBVar21[uVar10] < ip[uVar10]) {
      *local_e0 = uVar2;
      if (uVar2 <= uVar4) {
        local_e0 = &local_84;
LAB_001d71d3:
        *local_f0 = 0;
        *local_e0 = 0;
        if (0x40000000 < local_d0) {
          __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8221,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        if (uVar18 + 8 < local_f4) {
          local_80->nextToUpdate = local_f4 - 8;
          return UVar20;
        }
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      puVar11 = puVar11 + 1;
      uVar9 = uVar10;
      local_e0 = puVar11;
    }
    else {
      *local_f0 = uVar2;
      local_f0 = puVar11;
      uVar22 = uVar10;
      if (uVar2 <= uVar4) {
        local_f0 = &local_84;
        goto LAB_001d71d3;
      }
    }
    uVar2 = *puVar11;
    local_d0 = local_d0 - 1;
  } while( true );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}